

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O3

void __thiscall CPrintVisitor::AddLabel(CPrintVisitor *this,string *label)

{
  CPrintVisitor *this_00;
  string local_58;
  string local_38;
  
  this_00 = (CPrintVisitor *)(label->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,this_00,
             (pointer)((long)&(this_00->super_IVisitor)._vptr_IVisitor + label->_M_string_length));
  ConstructLabel(&local_58,this_00,&local_38,this->lastVisited + 1);
  std::__cxx11::string::_M_append((char *)&this->description,(ulong)local_58._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CPrintVisitor::AddLabel(std::string label) {
	this->description += ConstructLabel(label, lastVisited + 1);
}